

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void __thiscall
Diligent::FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
          (FixedBlockMemoryAllocator *this,IMemoryAllocator *RawMemoryAllocator,size_t BlockSize,
          Uint32 NumBlocksInPage)

{
  size_t sVar1;
  STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator> local_98;
  STDAllocator<unsigned_long,_Diligent::IMemoryAllocator> local_68;
  STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator> local_48
  ;
  Uint32 local_24;
  size_t sStack_20;
  Uint32 NumBlocksInPage_local;
  size_t BlockSize_local;
  IMemoryAllocator *RawMemoryAllocator_local;
  FixedBlockMemoryAllocator *this_local;
  
  local_24 = NumBlocksInPage;
  sStack_20 = BlockSize;
  BlockSize_local = (size_t)RawMemoryAllocator;
  RawMemoryAllocator_local = &this->super_IMemoryAllocator;
  IMemoryAllocator::IMemoryAllocator(&this->super_IMemoryAllocator);
  (this->super_IMemoryAllocator)._vptr_IMemoryAllocator = (_func_int **)&PTR_Allocate_01410650;
  STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>::
  STDAllocator(&local_48,(IMemoryAllocator *)BlockSize_local,"Allocator for vector<MemoryPage>",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0xb0);
  std::
  vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ::vector(&this->m_PagePool,&local_48);
  STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>::STDAllocator
            (&local_68,(IMemoryAllocator *)BlockSize_local,"Allocator for unordered_set<size_t>",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
             ,0xb1);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
  ::unordered_set(&this->m_AvailablePages,&local_68);
  STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>::STDAllocator
            (&local_98,(IMemoryAllocator *)BlockSize_local,
             "Allocator for unordered_map<void*, size_t>",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
             ,0xb2);
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>_>
  ::unordered_map(&this->m_AddrToPageId,&local_98);
  std::mutex::mutex(&this->m_Mutex);
  this->m_RawMemoryAllocator = (IMemoryAllocator *)BlockSize_local;
  sVar1 = AdjustBlockSize(sStack_20);
  this->m_BlockSize = sVar1;
  this->m_NumBlocksInPage = local_24;
  if (this->m_BlockSize != 0) {
    CreateNewPage(this);
  }
  return;
}

Assistant:

FixedBlockMemoryAllocator::FixedBlockMemoryAllocator(IMemoryAllocator& RawMemoryAllocator,
                                                     size_t            BlockSize,
                                                     Uint32            NumBlocksInPage) :
    // clang-format off
    m_PagePool          (STD_ALLOCATOR_RAW_MEM(MemoryPage, RawMemoryAllocator, "Allocator for vector<MemoryPage>")),
    m_AvailablePages    (STD_ALLOCATOR_RAW_MEM(size_t, RawMemoryAllocator, "Allocator for unordered_set<size_t>") ),
    m_AddrToPageId      (STD_ALLOCATOR_RAW_MEM(AddrToPageIdMapElem, RawMemoryAllocator, "Allocator for unordered_map<void*, size_t>")),
    m_RawMemoryAllocator{RawMemoryAllocator        },
    m_BlockSize         {AdjustBlockSize(BlockSize)},
    m_NumBlocksInPage   {NumBlocksInPage           }
// clang-format on
{
    // Allocate one page
    if (m_BlockSize > 0)
    {
        CreateNewPage();
    }
}